

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O3

void __thiscall Chromosome::printInfo(Chromosome *this)

{
  long lVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  type_data_t local_38 [4];
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
  *local_30;
  __normal_iterator<const_TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_> local_28;
  __normal_iterator<const_TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_> local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"### Bester Kandidat ###",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Pairs: ",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Collisions: ",0xc);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->collisions);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Fitness: ",9);
  poVar2 = std::ostream::_M_insert<double>(this->fitness);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ID: ",4);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->id);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#######################",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  local_38[0].data = 2;
  local_20._M_current =
       (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28._M_current =
       (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_30 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
             ::
             create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>,__gnu_cxx::__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>>,__gnu_cxx::__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>>>
                       (&local_20,&local_28);
  lVar1 = *(long *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18));
  lVar4 = lVar1;
  if (lVar1 < 1) {
    lVar4 = 0;
  }
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::dump((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
          *)&local_38[0].bits,(ostream *)&std::cout,0 < lVar1,(uint)lVar4,0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  printCoordinates(this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                 *)&local_38[0].bits);
  return;
}

Assistant:

void Chromosome::printInfo() {
    std::cout << "### Bester Kandidat ###" << std::endl;
    std::cout << "Pairs: " << pairs.size() << std::endl;
    std::cout << "Collisions: " << collisions << std::endl;
    std::cout << "Fitness: " << fitness << std::endl;
    std::cout << "ID: " << id << std::endl;
    std::cout << "#######################" << std::endl;

    json j_vec(turnList);
    std::cout << j_vec << std::endl;
    printCoordinates();

}